

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NUMAMemoryPool.cpp
# Opt level: O2

void __thiscall xmrig::NUMAMemoryPool::~NUMAMemoryPool(NUMAMemoryPool *this)

{
  _Base_ptr p_Var1;
  
  (this->super_IMemoryPool)._vptr_IMemoryPool = (_func_int **)&PTR__NUMAMemoryPool_001bcc98;
  for (p_Var1 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>,_std::_Select1st<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
  ::~_Rb_tree(&(this->m_map)._M_t);
  return;
}

Assistant:

xmrig::NUMAMemoryPool::~NUMAMemoryPool()
{
    for (auto kv : m_map) {
        delete kv.second;
    }
}